

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_encoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeConstrainedMultiParallelogramEncoder
          (MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapEncodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data)

{
  MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *pMVar1;
  MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RDI;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffff98;
  PredictionSchemeWrapEncodingTransform<int,_int> *in_stack_ffffffffffffffa0;
  PointAttribute *in_stack_ffffffffffffffa8;
  MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *local_38;
  
  MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeEncoder
            (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  (in_RDI->
  super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>).
  super_PredictionSchemeTypedEncoderInterface<int,_int>.super_PredictionSchemeEncoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__MeshPredictionSchemeConstrainedMultiParallelogramEncoder_0032baf8;
  local_38 = in_RDI + 1;
  pMVar1 = in_RDI + 2;
  do {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x23f5c5);
    local_38 = (MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                *)&(local_38->
                   super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>
                   ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_;
  } while (local_38 !=
           (MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
            *)&pMVar1->mesh_data_);
  *(undefined4 *)&in_RDI[2].mesh_data_.mesh_ = 0;
  ShannonEntropyTracker::ShannonEntropyTracker((ShannonEntropyTracker *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23f60b);
  return;
}

Assistant:

MeshPredictionSchemeConstrainedMultiParallelogramEncoder(
      const PointAttribute *attribute, const TransformT &transform,
      const MeshDataT &mesh_data)
      : MeshPredictionSchemeEncoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        selected_mode_(Mode::OPTIMAL_MULTI_PARALLELOGRAM) {}